

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int BIO_s_custom_read(BIO *bio,char *dst,int length)

{
  uint uVar1;
  long *plVar2;
  
  plVar2 = (long *)BIO_get_data();
  uVar1 = *(uint *)(plVar2 + 2);
  if (uVar1 == 0) {
    BIO_set_flags((BIO *)bio,9);
    length = 0xffffffff;
  }
  else {
    if (uVar1 < (uint)length) {
      length = uVar1;
    }
    memcpy(dst,(void *)((ulong)*(uint *)((long)plVar2 + 0x14) + *plVar2),(long)length);
    *(int *)((long)plVar2 + 0x14) = *(int *)((long)plVar2 + 0x14) + length;
    *(int *)(plVar2 + 2) = (int)plVar2[2] - length;
  }
  return length;
}

Assistant:

int BIO_s_custom_read(BIO *bio, char *dst, int length) {
    struct loop_ssl_data *loop_ssl_data = (struct loop_ssl_data *) BIO_get_data(bio);

    //printf("BIO_s_custom_read\n");

    if (!loop_ssl_data->ssl_read_input_length) {
        BIO_set_flags(bio, BIO_FLAGS_SHOULD_RETRY | BIO_FLAGS_READ);
        return -1;
    }

    if ((unsigned int) length > loop_ssl_data->ssl_read_input_length) {
        length = loop_ssl_data->ssl_read_input_length;
    }

    memcpy(dst, loop_ssl_data->ssl_read_input + loop_ssl_data->ssl_read_input_offset, length);

    loop_ssl_data->ssl_read_input_offset += length;
    loop_ssl_data->ssl_read_input_length -= length;
    return length;
}